

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::ReadLogicalExpr_abi_cxx11_
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
           *this,int opcode)

{
  CStringRef arg0;
  CStringRef arg0_00;
  undefined8 *in_RSI;
  LogicalExpr *in_RDI;
  PairwiseArgHandler args_3;
  int num_args_1;
  LogicalArgHandler args_2;
  int num_args;
  LogicalExpr else_expr;
  LogicalExpr then_expr;
  LogicalExpr condition;
  char c;
  NumericExpr lhs;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
  args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  int in_stack_fffffffffffffcc8;
  Kind in_stack_fffffffffffffccc;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
  *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  int min_args;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  Kind KVar1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
  *in_stack_fffffffffffffcf0;
  LogicalExpr *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  Kind in_stack_fffffffffffffd04;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
  *in_stack_fffffffffffffd08;
  string *this_00;
  BasicCStringRef<char> local_2a0;
  int local_294;
  int local_28c;
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  BasicCStringRef<char> local_188;
  char local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [48];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [36];
  Kind local_24;
  OpCodeInfo *local_20;
  
  min_args = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  local_20 = GetOpCodeInfo((int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_24 = local_20->kind;
  switch(local_20->first_kind) {
  case NOT:
    ReadLogicalExpr_abi_cxx11_(in_stack_fffffffffffffd08);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnNot((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
            (LogicalExpr *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_48);
    break;
  case FIRST_BINARY_LOGICAL:
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
    ::BinaryArgReader(in_stack_fffffffffffffcf0,
                      (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                       *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::__cxx11::string::string(local_a8,local_88);
    std::__cxx11::string::string(local_d8,local_68);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnBinaryLogical((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                      in_stack_fffffffffffffcf8,&in_stack_fffffffffffffcf0->lhs);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_a8);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
    ::~BinaryArgReader(in_stack_fffffffffffffcd0);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_2a0,"expected logical expression opcode");
    arg0_00.data_._4_4_ = in_stack_fffffffffffffd04;
    arg0_00.data_._0_4_ = in_stack_fffffffffffffd00;
    BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffcf8,arg0_00);
    std::__cxx11::string::string((string *)in_RDI);
    break;
  case FIRST_RELATIONAL:
    this_00 = local_118;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
                       *)in_stack_fffffffffffffcf0,
                      (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                       *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::__cxx11::string::string(local_138,this_00);
    std::__cxx11::string::string(local_158,local_f8);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnRelational((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_00,in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                   &in_stack_fffffffffffffcf0->lhs);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_138);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
    ::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
    ::~BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::NumericExprReader>
                        *)in_stack_fffffffffffffcd0);
    break;
  case ATLEAST:
    ReadNumericExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    local_179 = ReaderBase::ReadChar((ReaderBase *)*in_RSI);
    if (local_179 == 'o') {
      in_stack_fffffffffffffd04 =
           NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
           ::ReadOpCode(in_stack_fffffffffffffce0);
      in_stack_fffffffffffffcf8 =
           (LogicalExpr *)GetOpCodeInfo((int)((ulong)in_stack_fffffffffffffce0 >> 0x20));
      if (*(int *)in_stack_fffffffffffffcf8 != 0x2f) goto LAB_0022922d;
    }
    else {
LAB_0022922d:
      in_stack_fffffffffffffcf0 =
           (BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>::LogicalExprReader>
            *)*in_RSI;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_188,"expected count expression");
      arg0.data_._4_4_ = in_stack_fffffffffffffd04;
      arg0.data_._0_4_ = in_stack_fffffffffffffd00;
      BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffcf8,arg0);
    }
    KVar1 = local_24;
    std::__cxx11::string::string(local_1a8,local_178);
    ReadCountExpr_abi_cxx11_
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                *)CONCAT44(KVar1,in_stack_fffffffffffffce8));
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnLogicalCount((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                     in_stack_fffffffffffffcf8,&in_stack_fffffffffffffcf0->lhs);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_178);
    break;
  case IMPLICATION:
    ReadLogicalExpr_abi_cxx11_(in_stack_fffffffffffffd08);
    ReadLogicalExpr_abi_cxx11_(in_stack_fffffffffffffd08);
    ReadLogicalExpr_abi_cxx11_(in_stack_fffffffffffffd08);
    std::__cxx11::string::string(local_248,local_1e8);
    std::__cxx11::string::string(local_268,local_208);
    std::__cxx11::string::string(local_288,local_228);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnImplication((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffd08,
                    (LogicalExpr *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    in_stack_fffffffffffffcf8,&in_stack_fffffffffffffcf0->lhs);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_1e8);
    break;
  case EXISTS:
    local_28c = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                ::ReadNumArgs(in_stack_fffffffffffffce0,min_args);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::BeginIteratedLogical
              ((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8);
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (in_stack_fffffffffffffce0,min_args,(ArgHandler *)in_stack_fffffffffffffcd0);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::EndIteratedLogical
              ((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI,in_RSI[2]);
    break;
  case ALLDIFF:
    local_294 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
                ::ReadNumArgs(in_stack_fffffffffffffce0,min_args);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::BeginPairwise((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8
                   );
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (in_stack_fffffffffffffce0,min_args,(ArgHandler *)in_stack_fffffffffffffcd0);
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::EndPairwise((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_RDI,in_RSI[2]);
  }
  return in_RDI;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}